

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void GA_Matmul_patch(char transa,char transb,void *alpha,void *beta,int g_a,int ailo,int aihi,
                    int ajlo,int ajhi,int g_b,int bilo,int bihi,int bjlo,int bjhi,int g_c,int cilo,
                    int cihi,int cjlo,int cjhi)

{
  logical lVar1;
  int in_R8D;
  Integer Icjhi;
  Integer Icjlo;
  Integer Icihi;
  Integer Icilo;
  Integer Ibjhi;
  Integer Ibjlo;
  Integer Ibihi;
  Integer Ibilo;
  Integer Iajhi;
  Integer Iajlo;
  Integer Iaihi;
  Integer Iailo;
  Integer Ig_c;
  Integer Ig_b;
  Integer Ig_a;
  Integer in_stack_00000158;
  Integer in_stack_00000160;
  void *in_stack_00000168;
  void *in_stack_00000170;
  char *in_stack_00000178;
  undefined4 in_stack_00000184;
  undefined4 in_stack_000001b4;
  undefined4 in_stack_000001bc;
  undefined4 in_stack_000001c4;
  undefined4 in_stack_000001cc;
  undefined4 in_stack_000001d4;
  undefined4 in_stack_000001dc;
  undefined4 in_stack_000001e4;
  Integer in_stack_000001e8;
  Integer in_stack_000001f0;
  Integer in_stack_000001f8;
  Integer in_stack_00000200;
  Integer in_stack_00000208;
  Integer in_stack_00000210;
  Integer in_stack_00000288;
  Integer in_stack_00000290;
  void *in_stack_00000298;
  void *in_stack_000002a0;
  char *in_stack_000002a8;
  char *in_stack_000002b0;
  Integer in_stack_000002f0;
  Integer in_stack_000002f8;
  Integer in_stack_00000300;
  Integer in_stack_00000308;
  Integer in_stack_00000310;
  Integer in_stack_00000318;
  Integer in_stack_00000320;
  Integer in_stack_00000328;
  Integer in_stack_00000330;
  Integer in_stack_00000338;
  Integer in_stack_00000340;
  Integer in_stack_00000348;
  Integer in_stack_00000350;
  
  lVar1 = pnga_is_mirrored((long)in_R8D);
  if (lVar1 == 0) {
    gai_matmul_patch_flag(1);
    pnga_matmul(in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,in_stack_00000298,
                in_stack_00000290,in_stack_00000288,in_stack_000002f0,in_stack_000002f8,
                in_stack_00000300,in_stack_00000308,in_stack_00000310,in_stack_00000318,
                in_stack_00000320,in_stack_00000328,in_stack_00000330,in_stack_00000338,
                in_stack_00000340,in_stack_00000348,in_stack_00000350);
    gai_matmul_patch_flag(0);
  }
  else {
    pnga_matmul_mirrored
              ((char *)CONCAT44(in_stack_00000184,aihi),in_stack_00000178,in_stack_00000170,
               in_stack_00000168,in_stack_00000160,in_stack_00000158,
               CONCAT44(in_stack_000001b4,bjlo),CONCAT44(in_stack_000001bc,bjhi),
               CONCAT44(in_stack_000001c4,g_c),CONCAT44(in_stack_000001cc,cilo),
               CONCAT44(in_stack_000001d4,cihi),CONCAT44(in_stack_000001dc,cjlo),
               CONCAT44(in_stack_000001e4,cjhi),in_stack_000001e8,in_stack_000001f0,
               in_stack_000001f8,in_stack_00000200,in_stack_00000208,in_stack_00000210);
  }
  return;
}

Assistant:

void GA_Matmul_patch(char transa, char transb, void* alpha, void *beta,
		     int g_a, int ailo, int aihi, int ajlo, int ajhi,
		     int g_b, int bilo, int bihi, int bjlo, int bjhi,
		     int g_c, int cilo, int cihi, int cjlo, int cjhi)

{
    Integer Ig_a = g_a;
    Integer Ig_b = g_b;
    Integer Ig_c = g_c;
#if 0
    Integer alo[2], ahi[2]; 
    Integer blo[2], bhi[2];
    Integer clo[2], chi[2];
    alo[0]=ailo+1; ahi[0]=aihi+1; alo[1]=ajlo+1; ahi[1]=ajhi+1;
    blo[0]=bilo+1; bhi[0]=bihi+1; blo[1]=bjlo+1; bhi[1]=bjhi+1;
    clo[0]=cilo+1; chi[0]=cihi+1; clo[1]=cjlo+1; chi[1]=cjhi+1;
    pnga_matmul_patch(transa, transb, alpha, beta, g_a, alo, ahi,
                         g_b, blo, bhi, g_c, clo, chi);
#else
    Integer Iailo=ailo+1, Iaihi=aihi+1, Iajlo=ajlo+1, Iajhi=ajhi+1;
    Integer Ibilo=bilo+1, Ibihi=bihi+1, Ibjlo=bjlo+1, Ibjhi=bjhi+1;
    Integer Icilo=cilo+1, Icihi=cihi+1, Icjlo=cjlo+1, Icjhi=cjhi+1;
    if(pnga_is_mirrored(Ig_a))
       wnga_matmul_mirrored(&transa, &transb, (void*)alpha, (void*)beta,
                  Ig_a, Iailo, Iaihi, Iajlo, Iajhi,
                  Ig_b, Ibilo, Ibihi, Ibjlo, Ibjhi,
                  Ig_c, Icilo, Icihi, Icjlo, Icjhi);
    else {
       gai_matmul_patch_flag(SET);
       wnga_matmul(&transa, &transb, (void*)alpha, (void*)beta,
             Ig_a, Iailo, Iaihi, Iajlo, Iajhi,
             Ig_b, Ibilo, Ibihi, Ibjlo, Ibjhi,
             Ig_c, Icilo, Icihi, Icjlo, Icjhi);
       gai_matmul_patch_flag(UNSET);
    }
#endif
}